

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O0

ma_bool32 ma_dr_flac__on_seek_memory(void *pUserData,int offset,ma_dr_flac_seek_origin origin)

{
  ma_dr_flac__memory_stream *memoryStream;
  ma_dr_flac_seek_origin origin_local;
  int offset_local;
  void *pUserData_local;
  ma_bool32 local_4;
  
  if (*(long *)((long)pUserData + 8) < (long)offset) {
    local_4 = 0;
  }
  else {
    if (origin == ma_dr_flac_seek_origin_current) {
      if (*(ulong *)((long)pUserData + 8) <
          (ulong)(*(long *)((long)pUserData + 0x10) + (long)offset)) {
        return 0;
      }
      *(long *)((long)pUserData + 0x10) = (long)offset + *(long *)((long)pUserData + 0x10);
    }
    else {
      if (*(ulong *)((long)pUserData + 8) < (ulong)(uint)offset) {
        return 0;
      }
      *(long *)((long)pUserData + 0x10) = (long)offset;
    }
    local_4 = 1;
  }
  return local_4;
}

Assistant:

static ma_bool32 ma_dr_flac__on_seek_memory(void* pUserData, int offset, ma_dr_flac_seek_origin origin)
{
    ma_dr_flac__memory_stream* memoryStream = (ma_dr_flac__memory_stream*)pUserData;
    MA_DR_FLAC_ASSERT(memoryStream != NULL);
    MA_DR_FLAC_ASSERT(offset >= 0);
    if (offset > (ma_int64)memoryStream->dataSize) {
        return MA_FALSE;
    }
    if (origin == ma_dr_flac_seek_origin_current) {
        if (memoryStream->currentReadPos + offset <= memoryStream->dataSize) {
            memoryStream->currentReadPos += offset;
        } else {
            return MA_FALSE;
        }
    } else {
        if ((ma_uint32)offset <= memoryStream->dataSize) {
            memoryStream->currentReadPos = offset;
        } else {
            return MA_FALSE;
        }
    }
    return MA_TRUE;
}